

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  ulong uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  ulong uVar60;
  long lVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  ulong *puVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  bool bVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_cc0 [16];
  long local_cb0;
  long local_ca8;
  undefined1 (*local_ca0) [16];
  ulong local_c98;
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined4 local_bd0;
  undefined4 uStack_bcc;
  undefined4 uStack_bc8;
  undefined4 uStack_bc4;
  undefined1 local_bc0 [16];
  undefined4 local_bb0;
  undefined4 uStack_bac;
  undefined4 uStack_ba8;
  undefined4 uStack_ba4;
  undefined4 local_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b98;
  undefined4 uStack_b94;
  undefined1 local_b90 [16];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined1 local_b70 [16];
  uint local_b60;
  uint uStack_b5c;
  uint uStack_b58;
  uint uStack_b54;
  uint uStack_b50;
  uint uStack_b4c;
  uint uStack_b48;
  uint uStack_b44;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar66 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar116 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar119 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar125 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar36 = fVar2 * 0.99999964;
  fVar37 = fVar3 * 0.99999964;
  fVar38 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_c98 = uVar67 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar97 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  iVar5 = (tray->tfar).field_0.i[k];
  auVar103 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  local_a20._16_16_ = mm_lookupmask_ps._240_16_;
  local_a20._0_16_ = mm_lookupmask_ps._0_16_;
  local_ca0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  bVar71 = true;
  auVar73._8_4_ = 0xbf800000;
  auVar73._0_8_ = 0xbf800000bf800000;
  auVar73._12_4_ = 0xbf800000;
  auVar73._16_4_ = 0xbf800000;
  auVar73._20_4_ = 0xbf800000;
  auVar73._24_4_ = 0xbf800000;
  auVar73._28_4_ = 0xbf800000;
  auVar73 = vblendvps_avx(auVar88,auVar73,local_a20);
  auVar113 = ZEXT3264(auVar73);
  do {
    uVar68 = puVar66[-1];
    puVar66 = puVar66 + -1;
    auVar91 = auVar97._0_16_;
    auVar98 = auVar103._0_16_;
    auVar114 = auVar116._0_16_;
    auVar117 = auVar119._0_16_;
    auVar121 = auVar125._0_16_;
    while ((uVar68 & 8) == 0) {
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar67),auVar114);
      auVar72._0_4_ = fVar36 * auVar39._0_4_;
      auVar72._4_4_ = fVar36 * auVar39._4_4_;
      auVar72._8_4_ = fVar36 * auVar39._8_4_;
      auVar72._12_4_ = fVar36 * auVar39._12_4_;
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar69),auVar117);
      auVar76._0_4_ = fVar37 * auVar39._0_4_;
      auVar76._4_4_ = fVar37 * auVar39._4_4_;
      auVar76._8_4_ = fVar37 * auVar39._8_4_;
      auVar76._12_4_ = fVar37 * auVar39._12_4_;
      auVar39 = vmaxps_avx(auVar72,auVar76);
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar65),auVar121);
      auVar77._0_4_ = fVar38 * auVar72._0_4_;
      auVar77._4_4_ = fVar38 * auVar72._4_4_;
      auVar77._8_4_ = fVar38 * auVar72._8_4_;
      auVar77._12_4_ = fVar38 * auVar72._12_4_;
      auVar72 = vmaxps_avx(auVar77,auVar91);
      auVar39 = vmaxps_avx(auVar39,auVar72);
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + local_c98),auVar114);
      auVar78._0_4_ = fVar2 * auVar72._0_4_;
      auVar78._4_4_ = fVar2 * auVar72._4_4_;
      auVar78._8_4_ = fVar2 * auVar72._8_4_;
      auVar78._12_4_ = fVar2 * auVar72._12_4_;
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar69 ^ 0x10)),auVar117);
      auVar85._0_4_ = fVar3 * auVar72._0_4_;
      auVar85._4_4_ = fVar3 * auVar72._4_4_;
      auVar85._8_4_ = fVar3 * auVar72._8_4_;
      auVar85._12_4_ = fVar3 * auVar72._12_4_;
      auVar72 = vminps_avx(auVar78,auVar85);
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar65 ^ 0x10)),auVar121);
      auVar86._0_4_ = fVar4 * auVar76._0_4_;
      auVar86._4_4_ = fVar4 * auVar76._4_4_;
      auVar86._8_4_ = fVar4 * auVar76._8_4_;
      auVar86._12_4_ = fVar4 * auVar76._12_4_;
      auVar76 = vminps_avx(auVar86,auVar98);
      auVar72 = vminps_avx(auVar72,auVar76);
      auVar39 = vcmpps_avx(auVar39,auVar72,2);
      uVar62 = vmovmskps_avx(auVar39);
      if (uVar62 == 0) goto LAB_0051d264;
      uVar60 = uVar68 & 0xfffffffffffffff0;
      lVar64 = 0;
      for (uVar68 = (ulong)(byte)uVar62; (uVar68 & 1) == 0;
          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        lVar64 = lVar64 + 1;
      }
      uVar68 = *(ulong *)(uVar60 + lVar64 * 8);
      uVar62 = (uVar62 & 0xff) - 1 & uVar62 & 0xff;
      uVar63 = (ulong)uVar62;
      if (uVar62 != 0) {
        *puVar66 = uVar68;
        lVar64 = 0;
        for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
          lVar64 = lVar64 + 1;
        }
        uVar62 = uVar62 - 1 & uVar62;
        uVar63 = (ulong)uVar62;
        bVar70 = uVar62 == 0;
        while( true ) {
          puVar66 = puVar66 + 1;
          uVar68 = *(ulong *)(uVar60 + lVar64 * 8);
          if (bVar70) break;
          *puVar66 = uVar68;
          lVar64 = 0;
          for (uVar68 = uVar63; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
            lVar64 = lVar64 + 1;
          }
          uVar63 = uVar63 - 1 & uVar63;
          bVar70 = uVar63 == 0;
        }
      }
    }
    local_cb0 = (ulong)((uint)uVar68 & 0xf) - 8;
    if (local_cb0 != 0) {
      uVar68 = uVar68 & 0xfffffffffffffff0;
      local_ca8 = 0;
      local_c60 = auVar113._0_32_;
      do {
        lVar61 = local_ca8 * 0x60;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar68 + 0x40 + lVar61)];
        auVar89._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x20 + lVar61));
        auVar89._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + lVar61));
        pfVar9 = ppfVar7[*(uint *)(uVar68 + 0x48 + lVar61)];
        auVar92._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x28 + lVar61));
        auVar92._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 8 + lVar61));
        pfVar10 = ppfVar7[*(uint *)(uVar68 + 0x44 + lVar61)];
        auVar105._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x24 + lVar61));
        auVar105._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 4 + lVar61));
        pfVar11 = ppfVar7[*(uint *)(uVar68 + 0x4c + lVar61)];
        auVar122._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x2c + lVar61));
        auVar122._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0xc + lVar61));
        lVar64 = uVar68 + 0x40 + lVar61;
        local_9e0 = *(undefined8 *)(lVar64 + 0x10);
        uStack_9d8 = *(undefined8 *)(lVar64 + 0x18);
        uStack_9d0 = local_9e0;
        uStack_9c8 = uStack_9d8;
        lVar64 = uVar68 + 0x50 + lVar61;
        local_a00 = *(undefined8 *)(lVar64 + 0x10);
        uStack_9f8 = *(undefined8 *)(lVar64 + 0x18);
        auVar76 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x10 + lVar61)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x18 + lVar61)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x10 + lVar61)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x18 + lVar61)));
        auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x14 + lVar61)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x1c + lVar61)))
        ;
        auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x14 + lVar61)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x1c + lVar61)))
        ;
        auVar78 = vunpcklps_avx(auVar39,auVar72);
        auVar85 = vunpcklps_avx(auVar76,auVar77);
        auVar39 = vunpckhps_avx(auVar76,auVar77);
        auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x30 + lVar61)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x38 + lVar61)));
        auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x30 + lVar61)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x38 + lVar61)));
        auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x34 + lVar61)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x3c + lVar61)))
        ;
        auVar76 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x34 + lVar61)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x3c + lVar61)))
        ;
        auVar76 = vunpcklps_avx(auVar72,auVar76);
        auVar87 = vunpcklps_avx(auVar77,auVar86);
        auVar72 = vunpckhps_avx(auVar77,auVar86);
        uStack_9f0 = local_a00;
        uStack_9e8 = uStack_9f8;
        auVar73 = vunpcklps_avx(auVar105,auVar122);
        auVar88 = vunpcklps_avx(auVar89,auVar92);
        auVar118 = vunpcklps_avx(auVar88,auVar73);
        auVar73 = vunpckhps_avx(auVar88,auVar73);
        auVar88 = vunpckhps_avx(auVar105,auVar122);
        auVar84 = vunpckhps_avx(auVar89,auVar92);
        auVar88 = vunpcklps_avx(auVar84,auVar88);
        auVar93._16_16_ = auVar85;
        auVar93._0_16_ = auVar85;
        auVar106._16_16_ = auVar39;
        auVar106._0_16_ = auVar39;
        auVar80._16_16_ = auVar78;
        auVar80._0_16_ = auVar78;
        auVar138._16_16_ = auVar87;
        auVar138._0_16_ = auVar87;
        auVar99._16_16_ = auVar72;
        auVar99._0_16_ = auVar72;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar123._4_4_ = uVar1;
        auVar123._0_4_ = uVar1;
        auVar123._8_4_ = uVar1;
        auVar123._12_4_ = uVar1;
        auVar123._16_4_ = uVar1;
        auVar123._20_4_ = uVar1;
        auVar123._24_4_ = uVar1;
        auVar123._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar134._4_4_ = uVar1;
        auVar134._0_4_ = uVar1;
        auVar134._8_4_ = uVar1;
        auVar134._12_4_ = uVar1;
        auVar134._16_4_ = uVar1;
        auVar134._20_4_ = uVar1;
        auVar134._24_4_ = uVar1;
        auVar134._28_4_ = uVar1;
        auVar74._16_16_ = auVar76;
        auVar74._0_16_ = auVar76;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar136._4_4_ = uVar1;
        auVar136._0_4_ = uVar1;
        auVar136._8_4_ = uVar1;
        auVar136._12_4_ = uVar1;
        auVar136._16_4_ = uVar1;
        auVar136._20_4_ = uVar1;
        auVar136._24_4_ = uVar1;
        auVar136._28_4_ = uVar1;
        local_c20 = vsubps_avx(auVar118,auVar123);
        auVar118 = vsubps_avx(auVar73,auVar134);
        local_c40 = vsubps_avx(auVar88,auVar136);
        auVar73 = vsubps_avx(auVar93,auVar123);
        auVar88 = vsubps_avx(auVar106,auVar134);
        auVar84 = vsubps_avx(auVar80,auVar136);
        auVar80 = vsubps_avx(auVar138,auVar123);
        auVar89 = vsubps_avx(auVar99,auVar134);
        auVar40 = vsubps_avx(auVar74,auVar136);
        local_a40 = vsubps_avx(auVar80,local_c20);
        local_a80 = vsubps_avx(auVar89,auVar118);
        local_a60 = vsubps_avx(auVar40,local_c40);
        auVar75._0_4_ = local_c20._0_4_ + auVar80._0_4_;
        auVar75._4_4_ = local_c20._4_4_ + auVar80._4_4_;
        auVar75._8_4_ = local_c20._8_4_ + auVar80._8_4_;
        auVar75._12_4_ = local_c20._12_4_ + auVar80._12_4_;
        auVar75._16_4_ = local_c20._16_4_ + auVar80._16_4_;
        auVar75._20_4_ = local_c20._20_4_ + auVar80._20_4_;
        auVar75._24_4_ = local_c20._24_4_ + auVar80._24_4_;
        auVar75._28_4_ = local_c20._28_4_ + auVar80._28_4_;
        auVar90._0_4_ = auVar118._0_4_ + auVar89._0_4_;
        auVar90._4_4_ = auVar118._4_4_ + auVar89._4_4_;
        auVar90._8_4_ = auVar118._8_4_ + auVar89._8_4_;
        auVar90._12_4_ = auVar118._12_4_ + auVar89._12_4_;
        auVar90._16_4_ = auVar118._16_4_ + auVar89._16_4_;
        auVar90._20_4_ = auVar118._20_4_ + auVar89._20_4_;
        auVar90._24_4_ = auVar118._24_4_ + auVar89._24_4_;
        auVar90._28_4_ = auVar118._28_4_ + auVar89._28_4_;
        fVar14 = local_c40._0_4_;
        auVar100._0_4_ = auVar40._0_4_ + fVar14;
        fVar15 = local_c40._4_4_;
        auVar100._4_4_ = auVar40._4_4_ + fVar15;
        fVar16 = local_c40._8_4_;
        auVar100._8_4_ = auVar40._8_4_ + fVar16;
        fVar17 = local_c40._12_4_;
        auVar100._12_4_ = auVar40._12_4_ + fVar17;
        fVar18 = local_c40._16_4_;
        auVar100._16_4_ = auVar40._16_4_ + fVar18;
        fVar19 = local_c40._20_4_;
        auVar100._20_4_ = auVar40._20_4_ + fVar19;
        fVar20 = local_c40._24_4_;
        auVar100._24_4_ = auVar40._24_4_ + fVar20;
        fVar104 = local_c40._28_4_;
        auVar100._28_4_ = auVar40._28_4_ + fVar104;
        auVar41._4_4_ = local_a60._4_4_ * auVar90._4_4_;
        auVar41._0_4_ = local_a60._0_4_ * auVar90._0_4_;
        auVar41._8_4_ = local_a60._8_4_ * auVar90._8_4_;
        auVar41._12_4_ = local_a60._12_4_ * auVar90._12_4_;
        auVar41._16_4_ = local_a60._16_4_ * auVar90._16_4_;
        auVar41._20_4_ = local_a60._20_4_ * auVar90._20_4_;
        auVar41._24_4_ = local_a60._24_4_ * auVar90._24_4_;
        auVar41._28_4_ = uVar1;
        auVar72 = vfmsub231ps_fma(auVar41,local_a80,auVar100);
        auVar42._4_4_ = local_a40._4_4_ * auVar100._4_4_;
        auVar42._0_4_ = local_a40._0_4_ * auVar100._0_4_;
        auVar42._8_4_ = local_a40._8_4_ * auVar100._8_4_;
        auVar42._12_4_ = local_a40._12_4_ * auVar100._12_4_;
        auVar42._16_4_ = local_a40._16_4_ * auVar100._16_4_;
        auVar42._20_4_ = local_a40._20_4_ * auVar100._20_4_;
        auVar42._24_4_ = local_a40._24_4_ * auVar100._24_4_;
        auVar42._28_4_ = auVar100._28_4_;
        auVar39 = vfmsub231ps_fma(auVar42,local_a60,auVar75);
        auVar44._4_4_ = local_a80._4_4_ * auVar75._4_4_;
        auVar44._0_4_ = local_a80._0_4_ * auVar75._0_4_;
        auVar44._8_4_ = local_a80._8_4_ * auVar75._8_4_;
        auVar44._12_4_ = local_a80._12_4_ * auVar75._12_4_;
        auVar44._16_4_ = local_a80._16_4_ * auVar75._16_4_;
        auVar44._20_4_ = local_a80._20_4_ * auVar75._20_4_;
        auVar44._24_4_ = local_a80._24_4_ * auVar75._24_4_;
        auVar44._28_4_ = auVar75._28_4_;
        auVar76 = vfmsub231ps_fma(auVar44,local_a40,auVar90);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar135._4_4_ = uVar1;
        auVar135._0_4_ = uVar1;
        auVar135._8_4_ = uVar1;
        auVar135._12_4_ = uVar1;
        auVar135._16_4_ = uVar1;
        auVar135._20_4_ = uVar1;
        auVar135._24_4_ = uVar1;
        auVar135._28_4_ = uVar1;
        local_ac0 = *(float *)(ray + k * 4 + 0x60);
        auVar45._4_4_ = local_ac0 * auVar76._4_4_;
        auVar45._0_4_ = local_ac0 * auVar76._0_4_;
        auVar45._8_4_ = local_ac0 * auVar76._8_4_;
        auVar45._12_4_ = local_ac0 * auVar76._12_4_;
        auVar45._16_4_ = local_ac0 * 0.0;
        auVar45._20_4_ = local_ac0 * 0.0;
        auVar45._24_4_ = local_ac0 * 0.0;
        auVar45._28_4_ = auVar90._28_4_;
        auVar39 = vfmadd231ps_fma(auVar45,auVar135,ZEXT1632(auVar39));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_aa0._4_4_ = uVar1;
        local_aa0._0_4_ = uVar1;
        local_aa0._8_4_ = uVar1;
        local_aa0._12_4_ = uVar1;
        local_aa0._16_4_ = uVar1;
        local_aa0._20_4_ = uVar1;
        local_aa0._24_4_ = uVar1;
        local_aa0._28_4_ = uVar1;
        auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),local_aa0,ZEXT1632(auVar72));
        local_ae0 = vsubps_avx(auVar118,auVar88);
        local_b00 = vsubps_avx(local_c40,auVar84);
        auVar137._0_4_ = auVar118._0_4_ + auVar88._0_4_;
        auVar137._4_4_ = auVar118._4_4_ + auVar88._4_4_;
        auVar137._8_4_ = auVar118._8_4_ + auVar88._8_4_;
        auVar137._12_4_ = auVar118._12_4_ + auVar88._12_4_;
        auVar137._16_4_ = auVar118._16_4_ + auVar88._16_4_;
        auVar137._20_4_ = auVar118._20_4_ + auVar88._20_4_;
        auVar137._24_4_ = auVar118._24_4_ + auVar88._24_4_;
        auVar137._28_4_ = auVar118._28_4_ + auVar88._28_4_;
        auVar101._0_4_ = fVar14 + auVar84._0_4_;
        auVar101._4_4_ = fVar15 + auVar84._4_4_;
        auVar101._8_4_ = fVar16 + auVar84._8_4_;
        auVar101._12_4_ = fVar17 + auVar84._12_4_;
        auVar101._16_4_ = fVar18 + auVar84._16_4_;
        auVar101._20_4_ = fVar19 + auVar84._20_4_;
        auVar101._24_4_ = fVar20 + auVar84._24_4_;
        fVar120 = auVar84._28_4_;
        auVar101._28_4_ = fVar104 + fVar120;
        fVar108 = local_b00._0_4_;
        fVar110 = local_b00._4_4_;
        auVar46._4_4_ = auVar137._4_4_ * fVar110;
        auVar46._0_4_ = auVar137._0_4_ * fVar108;
        fVar21 = local_b00._8_4_;
        auVar46._8_4_ = auVar137._8_4_ * fVar21;
        fVar24 = local_b00._12_4_;
        auVar46._12_4_ = auVar137._12_4_ * fVar24;
        fVar27 = local_b00._16_4_;
        auVar46._16_4_ = auVar137._16_4_ * fVar27;
        fVar30 = local_b00._20_4_;
        auVar46._20_4_ = auVar137._20_4_ * fVar30;
        fVar33 = local_b00._24_4_;
        auVar46._24_4_ = auVar137._24_4_ * fVar33;
        auVar46._28_4_ = fVar104;
        auVar76 = vfmsub231ps_fma(auVar46,local_ae0,auVar101);
        auVar41 = vsubps_avx(local_c20,auVar73);
        fVar104 = auVar41._0_4_;
        fVar111 = auVar41._4_4_;
        auVar47._4_4_ = auVar101._4_4_ * fVar111;
        auVar47._0_4_ = auVar101._0_4_ * fVar104;
        fVar22 = auVar41._8_4_;
        auVar47._8_4_ = auVar101._8_4_ * fVar22;
        fVar25 = auVar41._12_4_;
        auVar47._12_4_ = auVar101._12_4_ * fVar25;
        fVar28 = auVar41._16_4_;
        auVar47._16_4_ = auVar101._16_4_ * fVar28;
        fVar31 = auVar41._20_4_;
        auVar47._20_4_ = auVar101._20_4_ * fVar31;
        fVar34 = auVar41._24_4_;
        auVar47._24_4_ = auVar101._24_4_ * fVar34;
        auVar47._28_4_ = auVar101._28_4_;
        auVar132._0_4_ = local_c20._0_4_ + auVar73._0_4_;
        auVar132._4_4_ = local_c20._4_4_ + auVar73._4_4_;
        auVar132._8_4_ = local_c20._8_4_ + auVar73._8_4_;
        auVar132._12_4_ = local_c20._12_4_ + auVar73._12_4_;
        auVar132._16_4_ = local_c20._16_4_ + auVar73._16_4_;
        auVar132._20_4_ = local_c20._20_4_ + auVar73._20_4_;
        auVar132._24_4_ = local_c20._24_4_ + auVar73._24_4_;
        auVar132._28_4_ = local_c20._28_4_ + auVar73._28_4_;
        auVar72 = vfmsub231ps_fma(auVar47,local_b00,auVar132);
        fVar109 = local_ae0._0_4_;
        fVar112 = local_ae0._4_4_;
        auVar48._4_4_ = auVar132._4_4_ * fVar112;
        auVar48._0_4_ = auVar132._0_4_ * fVar109;
        fVar23 = local_ae0._8_4_;
        auVar48._8_4_ = auVar132._8_4_ * fVar23;
        fVar26 = local_ae0._12_4_;
        auVar48._12_4_ = auVar132._12_4_ * fVar26;
        fVar29 = local_ae0._16_4_;
        auVar48._16_4_ = auVar132._16_4_ * fVar29;
        fVar32 = local_ae0._20_4_;
        auVar48._20_4_ = auVar132._20_4_ * fVar32;
        fVar35 = local_ae0._24_4_;
        auVar48._24_4_ = auVar132._24_4_ * fVar35;
        auVar48._28_4_ = local_b00._28_4_;
        auVar77 = vfmsub231ps_fma(auVar48,auVar41,auVar137);
        auVar124._0_4_ = auVar77._0_4_ * local_ac0;
        auVar124._4_4_ = auVar77._4_4_ * local_ac0;
        auVar124._8_4_ = auVar77._8_4_ * local_ac0;
        auVar124._12_4_ = auVar77._12_4_ * local_ac0;
        auVar124._16_4_ = local_ac0 * 0.0;
        auVar124._20_4_ = local_ac0 * 0.0;
        auVar124._24_4_ = local_ac0 * 0.0;
        auVar124._28_4_ = 0;
        auVar72 = vfmadd231ps_fma(auVar124,auVar135,ZEXT1632(auVar72));
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_aa0,ZEXT1632(auVar76));
        auVar42 = vsubps_avx(auVar73,auVar80);
        auVar94._0_4_ = auVar73._0_4_ + auVar80._0_4_;
        auVar94._4_4_ = auVar73._4_4_ + auVar80._4_4_;
        auVar94._8_4_ = auVar73._8_4_ + auVar80._8_4_;
        auVar94._12_4_ = auVar73._12_4_ + auVar80._12_4_;
        auVar94._16_4_ = auVar73._16_4_ + auVar80._16_4_;
        auVar94._20_4_ = auVar73._20_4_ + auVar80._20_4_;
        auVar94._24_4_ = auVar73._24_4_ + auVar80._24_4_;
        auVar94._28_4_ = auVar73._28_4_ + auVar80._28_4_;
        auVar80 = vsubps_avx(auVar88,auVar89);
        auVar107._0_4_ = auVar88._0_4_ + auVar89._0_4_;
        auVar107._4_4_ = auVar88._4_4_ + auVar89._4_4_;
        auVar107._8_4_ = auVar88._8_4_ + auVar89._8_4_;
        auVar107._12_4_ = auVar88._12_4_ + auVar89._12_4_;
        auVar107._16_4_ = auVar88._16_4_ + auVar89._16_4_;
        auVar107._20_4_ = auVar88._20_4_ + auVar89._20_4_;
        auVar107._24_4_ = auVar88._24_4_ + auVar89._24_4_;
        auVar107._28_4_ = auVar88._28_4_ + auVar89._28_4_;
        auVar89 = vsubps_avx(auVar84,auVar40);
        auVar81._0_4_ = auVar84._0_4_ + auVar40._0_4_;
        auVar81._4_4_ = auVar84._4_4_ + auVar40._4_4_;
        auVar81._8_4_ = auVar84._8_4_ + auVar40._8_4_;
        auVar81._12_4_ = auVar84._12_4_ + auVar40._12_4_;
        auVar81._16_4_ = auVar84._16_4_ + auVar40._16_4_;
        auVar81._20_4_ = auVar84._20_4_ + auVar40._20_4_;
        auVar81._24_4_ = auVar84._24_4_ + auVar40._24_4_;
        auVar81._28_4_ = fVar120 + auVar40._28_4_;
        auVar84._4_4_ = auVar89._4_4_ * auVar107._4_4_;
        auVar84._0_4_ = auVar89._0_4_ * auVar107._0_4_;
        auVar84._8_4_ = auVar89._8_4_ * auVar107._8_4_;
        auVar84._12_4_ = auVar89._12_4_ * auVar107._12_4_;
        auVar84._16_4_ = auVar89._16_4_ * auVar107._16_4_;
        auVar84._20_4_ = auVar89._20_4_ * auVar107._20_4_;
        auVar84._24_4_ = auVar89._24_4_ * auVar107._24_4_;
        auVar84._28_4_ = fVar120;
        auVar77 = vfmsub231ps_fma(auVar84,auVar80,auVar81);
        auVar40._4_4_ = auVar81._4_4_ * auVar42._4_4_;
        auVar40._0_4_ = auVar81._0_4_ * auVar42._0_4_;
        auVar40._8_4_ = auVar81._8_4_ * auVar42._8_4_;
        auVar40._12_4_ = auVar81._12_4_ * auVar42._12_4_;
        auVar40._16_4_ = auVar81._16_4_ * auVar42._16_4_;
        auVar40._20_4_ = auVar81._20_4_ * auVar42._20_4_;
        auVar40._24_4_ = auVar81._24_4_ * auVar42._24_4_;
        auVar40._28_4_ = auVar81._28_4_;
        auVar76 = vfmsub231ps_fma(auVar40,auVar89,auVar94);
        auVar49._4_4_ = auVar80._4_4_ * auVar94._4_4_;
        auVar49._0_4_ = auVar80._0_4_ * auVar94._0_4_;
        auVar49._8_4_ = auVar80._8_4_ * auVar94._8_4_;
        auVar49._12_4_ = auVar80._12_4_ * auVar94._12_4_;
        auVar49._16_4_ = auVar80._16_4_ * auVar94._16_4_;
        auVar49._20_4_ = auVar80._20_4_ * auVar94._20_4_;
        auVar49._24_4_ = auVar80._24_4_ * auVar94._24_4_;
        auVar49._28_4_ = auVar94._28_4_;
        auVar78 = vfmsub231ps_fma(auVar49,auVar42,auVar107);
        auVar95._0_4_ = local_ac0 * auVar78._0_4_;
        auVar95._4_4_ = local_ac0 * auVar78._4_4_;
        auVar95._8_4_ = local_ac0 * auVar78._8_4_;
        auVar95._12_4_ = local_ac0 * auVar78._12_4_;
        auVar95._16_4_ = local_ac0 * 0.0;
        auVar95._20_4_ = local_ac0 * 0.0;
        auVar95._24_4_ = local_ac0 * 0.0;
        auVar95._28_4_ = 0;
        auVar76 = vfmadd231ps_fma(auVar95,auVar135,ZEXT1632(auVar76));
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_aa0,ZEXT1632(auVar77));
        local_9a0 = ZEXT1632(auVar72);
        local_9c0 = auVar39._0_4_;
        fStack_9bc = auVar39._4_4_;
        fStack_9b8 = auVar39._8_4_;
        fStack_9b4 = auVar39._12_4_;
        local_980 = ZEXT1632(CONCAT412(auVar76._12_4_ + auVar72._12_4_ + fStack_9b4,
                                       CONCAT48(auVar76._8_4_ + auVar72._8_4_ + fStack_9b8,
                                                CONCAT44(auVar76._4_4_ + auVar72._4_4_ + fStack_9bc,
                                                         auVar76._0_4_ + auVar72._0_4_ + local_9c0))
                                      ));
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar82._16_4_ = 0x7fffffff;
        auVar82._20_4_ = 0x7fffffff;
        auVar82._24_4_ = 0x7fffffff;
        auVar82._28_4_ = 0x7fffffff;
        auVar73 = vminps_avx(ZEXT1632(auVar39),local_9a0);
        auVar73 = vminps_avx(auVar73,ZEXT1632(auVar76));
        local_b40 = vandps_avx(local_980,auVar82);
        fVar120 = local_b40._0_4_ * 1.1920929e-07;
        fVar126 = local_b40._4_4_ * 1.1920929e-07;
        auVar50._4_4_ = fVar126;
        auVar50._0_4_ = fVar120;
        fVar127 = local_b40._8_4_ * 1.1920929e-07;
        auVar50._8_4_ = fVar127;
        fVar128 = local_b40._12_4_ * 1.1920929e-07;
        auVar50._12_4_ = fVar128;
        fVar129 = local_b40._16_4_ * 1.1920929e-07;
        auVar50._16_4_ = fVar129;
        fVar130 = local_b40._20_4_ * 1.1920929e-07;
        auVar50._20_4_ = fVar130;
        fVar131 = local_b40._24_4_ * 1.1920929e-07;
        auVar50._24_4_ = fVar131;
        auVar50._28_4_ = 0x34000000;
        auVar115._0_8_ = CONCAT44(fVar126,fVar120) ^ 0x8000000080000000;
        auVar115._8_4_ = -fVar127;
        auVar115._12_4_ = -fVar128;
        auVar115._16_4_ = -fVar129;
        auVar115._20_4_ = -fVar130;
        auVar115._24_4_ = -fVar131;
        auVar115._28_4_ = 0xb4000000;
        auVar73 = vcmpps_avx(auVar73,auVar115,5);
        local_b20 = ZEXT1632(auVar39);
        auVar84 = vmaxps_avx(local_b20,local_9a0);
        auVar88 = vmaxps_avx(auVar84,ZEXT1632(auVar76));
        auVar88 = vcmpps_avx(auVar88,auVar50,2);
        auVar88 = vorps_avx(auVar73,auVar88);
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar88 >> 0x7f,0) == '\0') &&
              (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar88 >> 0xbf,0) == '\0') &&
            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar88[0x1f]) {
LAB_0051d1eb:
          auVar113 = ZEXT3264(local_c60);
        }
        else {
          auVar51._4_4_ = fVar112 * local_a60._4_4_;
          auVar51._0_4_ = fVar109 * local_a60._0_4_;
          auVar51._8_4_ = fVar23 * local_a60._8_4_;
          auVar51._12_4_ = fVar26 * local_a60._12_4_;
          auVar51._16_4_ = fVar29 * local_a60._16_4_;
          auVar51._20_4_ = fVar32 * local_a60._20_4_;
          auVar51._24_4_ = fVar35 * local_a60._24_4_;
          auVar51._28_4_ = auVar73._28_4_;
          auVar52._4_4_ = local_a80._4_4_ * fVar111;
          auVar52._0_4_ = local_a80._0_4_ * fVar104;
          auVar52._8_4_ = local_a80._8_4_ * fVar22;
          auVar52._12_4_ = local_a80._12_4_ * fVar25;
          auVar52._16_4_ = local_a80._16_4_ * fVar28;
          auVar52._20_4_ = local_a80._20_4_ * fVar31;
          auVar52._24_4_ = local_a80._24_4_ * fVar34;
          auVar52._28_4_ = 0x34000000;
          auVar39 = vfmsub213ps_fma(local_a80,local_b00,auVar51);
          auVar53._4_4_ = auVar80._4_4_ * fVar110;
          auVar53._0_4_ = auVar80._0_4_ * fVar108;
          auVar53._8_4_ = auVar80._8_4_ * fVar21;
          auVar53._12_4_ = auVar80._12_4_ * fVar24;
          auVar53._16_4_ = auVar80._16_4_ * fVar27;
          auVar53._20_4_ = auVar80._20_4_ * fVar30;
          auVar53._24_4_ = auVar80._24_4_ * fVar33;
          auVar53._28_4_ = auVar84._28_4_;
          auVar54._4_4_ = auVar89._4_4_ * fVar111;
          auVar54._0_4_ = auVar89._0_4_ * fVar104;
          auVar54._8_4_ = auVar89._8_4_ * fVar22;
          auVar54._12_4_ = auVar89._12_4_ * fVar25;
          auVar54._16_4_ = auVar89._16_4_ * fVar28;
          auVar54._20_4_ = auVar89._20_4_ * fVar31;
          auVar54._24_4_ = auVar89._24_4_ * fVar34;
          auVar54._28_4_ = local_b40._28_4_;
          auVar76 = vfmsub213ps_fma(auVar89,local_ae0,auVar53);
          auVar73 = vandps_avx(auVar51,auVar82);
          auVar84 = vandps_avx(auVar53,auVar82);
          auVar73 = vcmpps_avx(auVar73,auVar84,1);
          local_960 = vblendvps_avx(ZEXT1632(auVar76),ZEXT1632(auVar39),auVar73);
          auVar55._4_4_ = fVar112 * auVar42._4_4_;
          auVar55._0_4_ = fVar109 * auVar42._0_4_;
          auVar55._8_4_ = fVar23 * auVar42._8_4_;
          auVar55._12_4_ = fVar26 * auVar42._12_4_;
          auVar55._16_4_ = fVar29 * auVar42._16_4_;
          auVar55._20_4_ = fVar32 * auVar42._20_4_;
          auVar55._24_4_ = fVar35 * auVar42._24_4_;
          auVar55._28_4_ = auVar73._28_4_;
          auVar39 = vfmsub213ps_fma(auVar42,local_b00,auVar54);
          auVar56._4_4_ = local_a40._4_4_ * fVar110;
          auVar56._0_4_ = local_a40._0_4_ * fVar108;
          auVar56._8_4_ = local_a40._8_4_ * fVar21;
          auVar56._12_4_ = local_a40._12_4_ * fVar24;
          auVar56._16_4_ = local_a40._16_4_ * fVar27;
          auVar56._20_4_ = local_a40._20_4_ * fVar30;
          auVar56._24_4_ = local_a40._24_4_ * fVar33;
          auVar56._28_4_ = auVar84._28_4_;
          auVar76 = vfmsub213ps_fma(local_a60,auVar41,auVar56);
          auVar73 = vandps_avx(auVar56,auVar82);
          auVar84 = vandps_avx(auVar54,auVar82);
          auVar73 = vcmpps_avx(auVar73,auVar84,1);
          local_940 = vblendvps_avx(ZEXT1632(auVar39),ZEXT1632(auVar76),auVar73);
          auVar39 = vfmsub213ps_fma(local_a40,local_ae0,auVar52);
          auVar76 = vfmsub213ps_fma(auVar80,auVar41,auVar55);
          auVar73 = vandps_avx(auVar52,auVar82);
          auVar84 = vandps_avx(auVar55,auVar82);
          auVar73 = vcmpps_avx(auVar73,auVar84,1);
          local_920 = vblendvps_avx(ZEXT1632(auVar76),ZEXT1632(auVar39),auVar73);
          auVar39 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
          fVar104 = local_920._0_4_;
          auVar83._0_4_ = fVar104 * local_ac0;
          fVar120 = local_920._4_4_;
          auVar83._4_4_ = fVar120 * local_ac0;
          fVar108 = local_920._8_4_;
          auVar83._8_4_ = fVar108 * local_ac0;
          fVar109 = local_920._12_4_;
          auVar83._12_4_ = fVar109 * local_ac0;
          fVar110 = local_920._16_4_;
          auVar83._16_4_ = fVar110 * local_ac0;
          fVar111 = local_920._20_4_;
          auVar83._20_4_ = fVar111 * local_ac0;
          fVar112 = local_920._24_4_;
          auVar83._24_4_ = fVar112 * local_ac0;
          auVar83._28_4_ = 0;
          auVar76 = vfmadd213ps_fma(auVar135,local_940,auVar83);
          auVar76 = vfmadd213ps_fma(local_aa0,local_960,ZEXT1632(auVar76));
          auVar84 = ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                       CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                CONCAT44(auVar76._4_4_ + auVar76._4_4_,
                                                         auVar76._0_4_ + auVar76._0_4_))));
          auVar57._4_4_ = fVar120 * fVar15;
          auVar57._0_4_ = fVar104 * fVar14;
          auVar57._8_4_ = fVar108 * fVar16;
          auVar57._12_4_ = fVar109 * fVar17;
          auVar57._16_4_ = fVar110 * fVar18;
          auVar57._20_4_ = fVar111 * fVar19;
          auVar57._24_4_ = fVar112 * fVar20;
          auVar57._28_4_ = auVar88._28_4_;
          auVar76 = vfmadd213ps_fma(auVar118,local_940,auVar57);
          auVar77 = vfmadd213ps_fma(local_c20,local_960,ZEXT1632(auVar76));
          auVar73 = vrcpps_avx(auVar84);
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = 0x3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar133._16_4_ = 0x3f800000;
          auVar133._20_4_ = 0x3f800000;
          auVar133._24_4_ = 0x3f800000;
          auVar133._28_4_ = 0x3f800000;
          auVar76 = vfnmadd213ps_fma(auVar73,auVar84,auVar133);
          auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar73,auVar73);
          local_8a0 = ZEXT1632(CONCAT412(auVar76._12_4_ * (auVar77._12_4_ + auVar77._12_4_),
                                         CONCAT48(auVar76._8_4_ * (auVar77._8_4_ + auVar77._8_4_),
                                                  CONCAT44(auVar76._4_4_ *
                                                           (auVar77._4_4_ + auVar77._4_4_),
                                                           auVar76._0_4_ *
                                                           (auVar77._0_4_ + auVar77._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar118._4_4_ = uVar1;
          auVar118._0_4_ = uVar1;
          auVar118._8_4_ = uVar1;
          auVar118._12_4_ = uVar1;
          auVar118._16_4_ = uVar1;
          auVar118._20_4_ = uVar1;
          auVar118._24_4_ = uVar1;
          auVar118._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_c00._4_4_ = uVar1;
          local_c00._0_4_ = uVar1;
          local_c00._8_4_ = uVar1;
          local_c00._12_4_ = uVar1;
          local_c00._16_4_ = uVar1;
          local_c00._20_4_ = uVar1;
          local_c00._24_4_ = uVar1;
          local_c00._28_4_ = uVar1;
          auVar73 = vcmpps_avx(auVar118,local_8a0,2);
          auVar88 = vcmpps_avx(local_8a0,local_c00,2);
          auVar73 = vandps_avx(auVar73,auVar88);
          auVar76 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar39 = vpand_avx(auVar76,auVar39);
          auVar73 = vpmovsxwd_avx2(auVar39);
          if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar73 >> 0x7f,0) == '\0') &&
                (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar73 >> 0xbf,0) == '\0') &&
              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar73[0x1f]) goto LAB_0051d1eb;
          auVar73 = vcmpps_avx(auVar84,_DAT_01faff00,4);
          auVar76 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar39 = vpand_avx(auVar39,auVar76);
          local_900 = vpmovsxwd_avx2(auVar39);
          if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_900 >> 0x7f,0) == '\0') &&
                (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_900 >> 0xbf,0) == '\0') &&
              (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_900[0x1f]) goto LAB_0051d1eb;
          uStack_9b0 = 0;
          uStack_9ac = 0;
          uStack_9a8 = 0;
          uStack_9a4 = 0;
          local_820 = local_a20;
          auVar73 = vrcpps_avx(local_980);
          auVar102._8_4_ = 0x3f800000;
          auVar102._0_8_ = 0x3f8000003f800000;
          auVar102._12_4_ = 0x3f800000;
          auVar102._16_4_ = 0x3f800000;
          auVar102._20_4_ = 0x3f800000;
          auVar102._24_4_ = 0x3f800000;
          auVar102._28_4_ = 0x3f800000;
          auVar76 = vfnmadd213ps_fma(local_980,auVar73,auVar102);
          auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar73,auVar73);
          auVar96._8_4_ = 0x219392ef;
          auVar96._0_8_ = 0x219392ef219392ef;
          auVar96._12_4_ = 0x219392ef;
          auVar96._16_4_ = 0x219392ef;
          auVar96._20_4_ = 0x219392ef;
          auVar96._24_4_ = 0x219392ef;
          auVar96._28_4_ = 0x219392ef;
          auVar73 = vcmpps_avx(local_b40,auVar96,5);
          auVar73 = vandps_avx(auVar73,ZEXT1632(auVar76));
          auVar58._4_4_ = fStack_9bc * auVar73._4_4_;
          auVar58._0_4_ = local_9c0 * auVar73._0_4_;
          auVar58._8_4_ = fStack_9b8 * auVar73._8_4_;
          auVar58._12_4_ = fStack_9b4 * auVar73._12_4_;
          auVar58._16_4_ = auVar73._16_4_ * 0.0;
          auVar58._20_4_ = auVar73._20_4_ * 0.0;
          auVar58._24_4_ = auVar73._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar88 = vminps_avx(auVar58,auVar102);
          auVar59._4_4_ = auVar72._4_4_ * auVar73._4_4_;
          auVar59._0_4_ = auVar72._0_4_ * auVar73._0_4_;
          auVar59._8_4_ = auVar72._8_4_ * auVar73._8_4_;
          auVar59._12_4_ = auVar72._12_4_ * auVar73._12_4_;
          auVar59._16_4_ = auVar73._16_4_ * 0.0;
          auVar59._20_4_ = auVar73._20_4_ * 0.0;
          auVar59._24_4_ = auVar73._24_4_ * 0.0;
          auVar59._28_4_ = auVar41._28_4_;
          auVar73 = vminps_avx(auVar59,auVar102);
          auVar84 = vsubps_avx(auVar102,auVar88);
          auVar118 = vsubps_avx(auVar102,auVar73);
          local_8c0 = vblendvps_avx(auVar73,auVar84,local_a20);
          local_8e0 = vblendvps_avx(auVar88,auVar118,local_a20);
          auVar113 = ZEXT3264(local_c60);
          fVar14 = local_c60._0_4_;
          fVar15 = local_c60._4_4_;
          fVar16 = local_c60._8_4_;
          fVar17 = local_c60._12_4_;
          fVar18 = local_c60._16_4_;
          fVar19 = local_c60._20_4_;
          fVar20 = local_c60._24_4_;
          local_860._4_4_ = fVar15 * local_940._4_4_;
          local_860._0_4_ = fVar14 * local_940._0_4_;
          local_860._8_4_ = fVar16 * local_940._8_4_;
          local_860._12_4_ = fVar17 * local_940._12_4_;
          local_860._16_4_ = fVar18 * local_940._16_4_;
          local_860._20_4_ = fVar19 * local_940._20_4_;
          local_860._24_4_ = fVar20 * local_940._24_4_;
          local_860._28_4_ = local_8c0._28_4_;
          local_880[0] = local_960._0_4_ * fVar14;
          local_880[1] = local_960._4_4_ * fVar15;
          local_880[2] = local_960._8_4_ * fVar16;
          local_880[3] = local_960._12_4_ * fVar17;
          fStack_870 = local_960._16_4_ * fVar18;
          fStack_86c = local_960._20_4_ * fVar19;
          fStack_868 = local_960._24_4_ * fVar20;
          uStack_864 = local_8e0._28_4_;
          local_840[0] = fVar14 * fVar104;
          local_840[1] = fVar15 * fVar120;
          local_840[2] = fVar16 * fVar108;
          local_840[3] = fVar17 * fVar109;
          fStack_830 = fVar18 * fVar110;
          fStack_82c = fVar19 * fVar111;
          fStack_828 = fVar20 * fVar112;
          uStack_824 = auVar84._28_4_;
          auVar39 = vpacksswb_avx(auVar39,auVar39);
          uVar60 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar39 >> 0x3f,0) << 7);
          fStack_abc = local_ac0;
          fStack_ab8 = local_ac0;
          fStack_ab4 = local_ac0;
          fStack_ab0 = local_ac0;
          fStack_aac = local_ac0;
          fStack_aa8 = local_ac0;
          fStack_aa4 = local_ac0;
          do {
            uVar63 = 0;
            for (uVar43 = uVar60; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              uVar63 = uVar63 + 1;
            }
            uVar62 = *(uint *)((long)&local_9e0 + uVar63 * 4);
            pGVar12 = (pSVar6->geometries).items[uVar62].ptr;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar60 = uVar60 ^ 1L << (uVar63 & 0x3f);
            }
            else {
              local_c20._0_8_ = uVar63;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0051d27a:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar71;
              }
              local_c40._0_8_ = uVar60;
              uVar60 = (ulong)(uint)((int)uVar63 * 4);
              local_ba0 = *(undefined4 *)(local_8e0 + uVar60);
              uVar1 = *(undefined4 *)(local_8c0 + uVar60);
              local_b90._4_4_ = uVar1;
              local_b90._0_4_ = uVar1;
              local_b90._8_4_ = uVar1;
              local_b90._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar60);
              local_c90.context = context->user;
              local_b70._4_4_ = uVar62;
              local_b70._0_4_ = uVar62;
              local_b70._8_4_ = uVar62;
              local_b70._12_4_ = uVar62;
              local_b80 = *(undefined4 *)((long)&local_a00 + uVar60);
              local_bd0 = *(undefined4 *)((long)local_880 + uVar60);
              uVar1 = *(undefined4 *)(local_860 + uVar60);
              local_bc0._4_4_ = uVar1;
              local_bc0._0_4_ = uVar1;
              local_bc0._8_4_ = uVar1;
              local_bc0._12_4_ = uVar1;
              local_bb0 = *(undefined4 *)((long)local_840 + uVar60);
              vpcmpeqd_avx2(ZEXT1632(local_b70),ZEXT1632(local_b70));
              uStack_b5c = (local_c90.context)->instID[0];
              local_b60 = uStack_b5c;
              uStack_b58 = uStack_b5c;
              uStack_b54 = uStack_b5c;
              uStack_b50 = (local_c90.context)->instPrimID[0];
              uStack_b4c = uStack_b50;
              uStack_b48 = uStack_b50;
              uStack_b44 = uStack_b50;
              local_cc0 = *local_ca0;
              local_c90.valid = (int *)local_cc0;
              local_c90.geometryUserPtr = pGVar12->userPtr;
              local_c90.hit = (RTCHitN *)&local_bd0;
              local_c90.N = 4;
              local_c90.ray = (RTCRayN *)ray;
              uStack_bcc = local_bd0;
              uStack_bc8 = local_bd0;
              uStack_bc4 = local_bd0;
              uStack_bac = local_bb0;
              uStack_ba8 = local_bb0;
              uStack_ba4 = local_bb0;
              uStack_b9c = local_ba0;
              uStack_b98 = local_ba0;
              uStack_b94 = local_ba0;
              uStack_b7c = local_b80;
              uStack_b78 = local_b80;
              uStack_b74 = local_b80;
              if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar12->occlusionFilterN)(&local_c90);
              }
              if (local_cc0 == (undefined1  [16])0x0) {
                auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar39 = auVar39 ^ _DAT_01f7ae20;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var13)(&local_c90);
                }
                auVar72 = vpcmpeqd_avx(local_cc0,_DAT_01f7aa10);
                auVar39 = auVar72 ^ _DAT_01f7ae20;
                auVar87._8_4_ = 0xff800000;
                auVar87._0_8_ = 0xff800000ff800000;
                auVar87._12_4_ = 0xff800000;
                auVar72 = vblendvps_avx(auVar87,*(undefined1 (*) [16])(local_c90.ray + 0x80),auVar72
                                       );
                *(undefined1 (*) [16])(local_c90.ray + 0x80) = auVar72;
              }
              auVar113 = ZEXT3264(local_c60);
              auVar79._8_8_ = 0x100000001;
              auVar79._0_8_ = 0x100000001;
              if ((auVar79 & auVar39) != (undefined1  [16])0x0) goto LAB_0051d27a;
              *(int *)(ray + k * 4 + 0x80) = local_c00._0_4_;
              uVar60 = local_c40._0_8_ ^ 1L << (local_c20._0_8_ & 0x3f);
            }
          } while (uVar60 != 0);
        }
        auVar125 = ZEXT1664(auVar121);
        auVar119 = ZEXT1664(auVar117);
        auVar116 = ZEXT1664(auVar114);
        auVar103 = ZEXT1664(auVar98);
        auVar97 = ZEXT1664(auVar91);
        local_ca8 = local_ca8 + 1;
      } while (local_ca8 != local_cb0);
    }
LAB_0051d264:
    bVar71 = puVar66 != &local_800;
    if (!bVar71) {
      return bVar71;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }